

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::copyCredentials
          (QHttpNetworkConnectionPrivate *this,int fromChannel,QAuthenticator *auth,bool isProxy)

{
  int iVar1;
  QAuthenticatorPrivate *pQVar2;
  byte in_CL;
  QAuthenticator *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  QAuthenticator *otherAuth;
  QAuthenticatorPrivate *priv;
  QString *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  QString *in_stack_ffffffffffffff18;
  int local_cc;
  QString *local_c8;
  undefined1 local_80 [24];
  undefined1 local_68 [48];
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_ESI < 0) ||
      (pQVar2 = QAuthenticatorPrivate::getPrivate(in_RDX), pQVar2 == (QAuthenticatorPrivate *)0x0))
     || ((pQVar2->method != Ntlm && (pQVar2->method != Negotiate)))) {
    for (local_cc = 0; local_cc < *(int *)(in_RDI + 0xa0); local_cc = local_cc + 1) {
      if (local_cc != in_ESI) {
        if ((in_CL & 1) == 0) {
          local_c8 = (QString *)(*(long *)(in_RDI + 0xb8) + (long)local_cc * 0x108 + 0x60);
        }
        else {
          local_c8 = (QString *)(*(long *)(in_RDI + 0xb8) + (long)local_cc * 0x108 + 0x68);
        }
        QAuthenticator::user((QAuthenticator *)in_stack_ffffffffffffff18);
        QAuthenticator::user((QAuthenticator *)in_stack_ffffffffffffff18);
        iVar1 = QString::compare((QString *)local_20,(CaseSensitivity)local_38);
        QString::~QString((QString *)0x2ebddc);
        QString::~QString((QString *)0x2ebde9);
        if (iVar1 != 0) {
          in_stack_ffffffffffffff18 = local_c8;
          QAuthenticator::user((QAuthenticator *)local_c8);
          QAuthenticator::setUser
                    ((QAuthenticator *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                     ,in_stack_ffffffffffffff08);
          QString::~QString((QString *)0x2ebe2d);
        }
        QAuthenticator::password((QAuthenticator *)in_stack_ffffffffffffff18);
        QAuthenticator::password((QAuthenticator *)in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff14 = QString::compare((QString *)local_68,(CaseSensitivity)local_80);
        QString::~QString((QString *)0x2ebe73);
        QString::~QString((QString *)0x2ebe80);
        if (in_stack_ffffffffffffff14 != 0) {
          QAuthenticator::password((QAuthenticator *)in_stack_ffffffffffffff18);
          QAuthenticator::setPassword
                    ((QAuthenticator *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                     ,local_c8);
          QString::~QString((QString *)0x2ebeb9);
          in_stack_ffffffffffffff08 = local_c8;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::copyCredentials(int fromChannel, QAuthenticator *auth, bool isProxy)
{
    Q_ASSERT(auth);

    // NTLM and Negotiate do multi-phase authentication.
    // Copying credentialsbetween authenticators would mess things up.
    if (fromChannel >= 0) {
        QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(*auth);
        if (priv
            && (priv->method == QAuthenticatorPrivate::Ntlm
                || priv->method == QAuthenticatorPrivate::Negotiate)) {
            return;
        }
    }

    // select another channel
    QAuthenticator* otherAuth = nullptr;
    for (int i = 0; i < activeChannelCount; ++i) {
        if (i == fromChannel)
            continue;
        if (isProxy)
            otherAuth = &channels[i].proxyAuthenticator;
        else
            otherAuth = &channels[i].authenticator;
        // if the credentials are different, copy them
        if (otherAuth->user().compare(auth->user()))
            otherAuth->setUser(auth->user());
        if (otherAuth->password().compare(auth->password()))
            otherAuth->setPassword(auth->password());
    }
}